

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

int dlep_writer_add_status(dlep_writer *writer,dlep_status status,char *text)

{
  size_t sVar1;
  size_t txtlen;
  char *pcStack_28;
  uint8_t value;
  char *text_local;
  dlep_writer *pdStack_18;
  dlep_status status_local;
  dlep_writer *writer_local;
  
  txtlen._7_1_ = (undefined1)status;
  pcStack_28 = text;
  text_local._4_4_ = status;
  pdStack_18 = writer;
  sVar1 = strlen(text);
  if (sVar1 < 0xffff) {
    dlep_writer_add_tlv2(pdStack_18,1,(void *)((long)&txtlen + 7),1,pcStack_28,(uint16_t)sVar1);
    writer_local._4_4_ = 0;
  }
  else {
    writer_local._4_4_ = -1;
  }
  return writer_local._4_4_;
}

Assistant:

int
dlep_writer_add_status(struct dlep_writer *writer, enum dlep_status status, const char *text) {
  uint8_t value;
  size_t txtlen;

  value = status;
  txtlen = strlen(text);
  if (txtlen > 65534) {
    return -1;
  }

  dlep_writer_add_tlv2(writer, DLEP_STATUS_TLV, &value, sizeof(value), text, txtlen);
  return 0;
}